

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O1

void Fl::watch_widget_pointer(Fl_Widget **w)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = num_widget_watch;
  lVar3 = (long)num_widget_watch;
  if (0 < lVar3) {
    lVar2 = 0;
    do {
      if (widget_watch[lVar2] == w) {
        return;
      }
      lVar2 = lVar2 + 1;
    } while (lVar3 != lVar2);
  }
  lVar2 = (long)max_widget_watch;
  if (num_widget_watch == max_widget_watch) {
    max_widget_watch = max_widget_watch + 8;
    widget_watch = (Fl_Widget ***)realloc(widget_watch,lVar2 * 8 + 0x40);
  }
  num_widget_watch = iVar1 + 1;
  widget_watch[lVar3] = w;
  return;
}

Assistant:

void Fl::watch_widget_pointer(Fl_Widget *&w)
{
  Fl_Widget **wp = &w;
  int i;
  for (i=0; i<num_widget_watch; ++i) {
    if (widget_watch[i]==wp) return;
  }
  if (num_widget_watch==max_widget_watch) {
    max_widget_watch += 8;
    widget_watch = (Fl_Widget***)realloc(widget_watch, sizeof(Fl_Widget**)*max_widget_watch);
  }
  widget_watch[num_widget_watch++] = wp;
#ifdef DEBUG_WATCH
  printf ("\nwatch_widget_pointer:   (%d/%d) %8p => %8p\n",
    num_widget_watch,num_widget_watch,wp,*wp);
  fflush(stdout);
#endif // DEBUG_WATCH
}